

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_3dPoint * __thiscall ON_3dPoint::operator=(ON_3dPoint *this,double *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  
  if (p == (double *)0x0) {
    this->x = 0.0;
    this->y = 0.0;
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    this->x = *p;
    this->y = p[1];
    uVar1 = SUB84(p[2],0);
    uVar2 = (undefined4)((ulong)p[2] >> 0x20);
  }
  this->z = (double)CONCAT44(uVar2,uVar1);
  return this;
}

Assistant:

ON_3dPoint& ON_3dPoint::operator=(const double* p)
{
  if ( p ) {
    x = p[0];
    y = p[1];
    z = p[2];
  }
  else {
    x = y = z = 0.0;
  }
  return *this;
}